

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 __thiscall lrit::File::getData(File *this)

{
  runtime_error *this_00;
  long in_RSI;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (*(long *)(in_RSI + 8) == 0) {
    if (*(long *)(in_RSI + 0x20) == *(long *)(in_RSI + 0x28)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"unreachable","");
      std::runtime_error::runtime_error(this_00,(string *)local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    getDataFromBuffer(this);
  }
  else {
    getDataFromFile(this);
  }
  return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::istream> File::getData() const {
  if (!file_.empty()) {
    return getDataFromFile();
  }
  if (!buf_.empty()) {
    return getDataFromBuffer();
  }
  ERROR("unreachable");
}